

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::AdvancedUsageSyncCS::Run(AdvancedUsageSyncCS *this)

{
  bool bVar1;
  GLuint GVar2;
  void *pvVar3;
  uint local_154;
  int i_6;
  int *data_13;
  int ref_data_6 [2];
  int i_5;
  int *data_12;
  int ref_data_5 [2];
  int i_4;
  int *data_11;
  int ref_data_4 [4];
  int i_3;
  int *data_10;
  int ref_data_3 [1];
  int i_2;
  int *data_9;
  int ref_data_2 [2];
  int i_1;
  int *data_8;
  int ref_data_1 [2];
  int i;
  int *data_7;
  int ref_data [4];
  int data_6 [2];
  int data_5 [2];
  int data_4 [4];
  undefined1 local_7c [4];
  undefined8 uStack_78;
  int data_3 [1];
  int data_2 [2];
  int data_1 [2];
  int data [4];
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *glsl_cs;
  AdvancedUsageSyncCS *this_local;
  
  local_20 = 
  "\nlayout(local_size_x = 1) in;\nlayout(std430, binding = 0) coherent buffer Buffer0 {\n  int g_data0, g_inc0;\n  int g_data1, g_inc1;\n};\nlayout(std430, binding = 1) buffer Buffer12 {\n  int inc, data;\n} g_buffer12[2];\nlayout(binding = 3, std430) coherent buffer Buffer3 {\n  int data;\n} g_buffer3;\nlayout(std430, binding = 4) coherent buffer Buffer4 {\n  int data0, inc0;\n  int data1, inc1;\n} g_buffer4;\nlayout(std430, binding = 5) buffer Buffer56 {\n  int inc, data;\n} g_buffer56[2];\n\nvoid Modify1(int path) {\n  if (path == 0) {\n    atomicAdd(g_data0, g_inc0);\n    atomicAdd(g_data1, g_inc0);\n  } else if (path == 1) {\n    atomicAdd(g_data0, - g_inc0);\n    atomicAdd(g_data1, - g_inc0);\n  } else if (path == 2) {\n    atomicAdd(g_data0, g_inc1);\n    atomicAdd(g_data1, g_inc1);\n  }\n  if (path == 0) {\n    g_buffer12[0].data += g_buffer12[1].inc;\n  } else if (path == 1) {\n    g_buffer12[1].data += g_buffer12[0].inc;\n  }\n}\n\nvoid Modify2(int path) {\n  if (path == 0) {\n    atomicAdd(g_buffer4.data0, g_buffer4.inc0);\n    atomicAdd(g_buffer4.data1, g_buffer4.inc0);\n  } else if (path == 1) {\n    atomicAdd(g_buffer4.data0, - g_buffer4.inc0);\n    atomicAdd(g_buffer4.data1, - g_buffer4.inc0);\n  } else if (path == 2) {\n    atomicAdd(g_buffer4.data0, g_buffer4.inc1);\n    atomicAdd(g_buffer4.data1, g_buffer4.inc1);\n  }\n  if (path == 0) {\n    g_buffer56[0].data += g_buffer56[1].inc;\n  } else if (path == 1) {\n    g_buffer56[1].data += g_buffer56[0].inc;\n  }\n}\n\nvoid main() {\n  Modify1(int(gl_WorkGroupID.z));\n  atomicAdd(g_buffer3.data, 1);\n  Modify2(int(gl_WorkGroupID.z));\n}"
  ;
  glsl_cs = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "\nlayout(local_size_x = 1) in;\nlayout(std430, binding = 0) coherent buffer Buffer0 {\n  int g_data0, g_inc0;\n  int g_data1, g_inc1;\n};\nlayout(std430, binding = 1) buffer Buffer12 {\n  int inc, data;\n} g_buffer12[2];\nlayout(binding = 3, std430) coherent buffer Buffer3 {\n  int data;\n} g_buffer3;\nlayout(std430, binding = 4) coherent buffer Buffer4 {\n  int data0, inc0;\n  int data1, inc1;\n} g_buffer4;\nlayout(std430, binding = 5) buffer Buffer56 {\n  int inc, data;\n} g_buffer56[2];\n\nvoid Modify1(int path) {\n  if (path == 0) {\n    atomicAdd(g_data0, g_inc0);\n    atomicAdd(g_data1, g_inc0);\n  } else if (path == 1) {\n    atomicAdd(g_data0, - g_inc0);\n    atomicAdd(g_data1, - g_inc0);\n  } else if (path == 2) {\n    atomicAdd(g_data0, g_inc1);\n    atomicAdd(g_data1, g_inc1);\n  }\n  if (path == 0) {\n    g_buffer12[0].data += g_buffer12[1].inc;\n  } else if (path == 1) {\n    g_buffer12[1].data += g_buffer12[0].inc;\n  }\n}\n\nvoid Modify2(int path) {\n  if (path == 0) {\n    atomicAdd(g_buffer4.data0, g_buffer4.inc0);\n    atomicAdd(g_buffer4.data1, g_buffer4.inc0);\n  } else if (path == 1) {\n    atomicAdd(g_buffer4.data0, - g_buffer4.inc0);\n    atomicAdd(g_buffer4.data1, - g_buffer4.inc0);\n  } else if (path == 2) {\n    atomicAdd(g_buffer4.data0, g_buffer4.inc1);\n    atomicAdd(g_buffer4.data1, g_buffer4.inc1);\n  }\n  if (path == 0) {\n    g_buffer56[0].data += g_buffer56[1].inc;\n  } else if (path == 1) {\n    g_buffer56[1].data += g_buffer56[0].inc;\n  }\n}\n\nvoid main() {\n  Modify1(int(gl_WorkGroupID.z));\n  atomicAdd(g_buffer3.data, 1);\n  Modify2(int(gl_WorkGroupID.z));\n}"
             ,&local_41);
  GVar2 = ShaderStorageBufferObjectBase::CreateProgramCS
                    (&this->super_ShaderStorageBufferObjectBase,&local_40);
  this->m_program = GVar2;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_program);
  bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                    (&this->super_ShaderStorageBufferObjectBase,this->m_program);
  if (bVar1) {
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,7,this->m_storage_buffer);
    data_1[0] = 0;
    data_1[1] = 1;
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0,this->m_storage_buffer[0]);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0x10,data_1,0x88ea);
    data_2[0] = 3;
    data_2[1] = 1;
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,1,this->m_storage_buffer[1]);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,8,data_2,0x88ea);
    uStack_78 = 0x400000002;
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,2,this->m_storage_buffer[2]);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,8,&stack0xffffffffffffff88,0x88ea);
    memset(local_7c,0,4);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,3,this->m_storage_buffer[3]);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,4,local_7c,0x88ea);
    data_5[0] = 0;
    data_5[1] = 1;
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,4,this->m_storage_buffer[4]);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0x10,data_5,0x88ea);
    data_6[0] = 3;
    data_6[1] = 1;
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,5,this->m_storage_buffer[5]);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,8,data_6,0x88ea);
    ref_data[2] = 2;
    ref_data[3] = 4;
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,6,this->m_storage_buffer[6]);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,8,ref_data + 2,0x88ea);
    glu::CallLogWrapper::glUseProgram
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
    glu::CallLogWrapper::glDispatchCompute
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,1,3);
    glu::CallLogWrapper::glMemoryBarrier
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x2000);
    glu::CallLogWrapper::glDispatchCompute
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,1,3);
    glu::CallLogWrapper::glMemoryBarrier
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x200);
    ref_data[0] = 4;
    ref_data[1] = 2;
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,this->m_storage_buffer[0]);
    register0x00000000 =
         glu::CallLogWrapper::glMapBufferRange
                   (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                     super_CallLogWrapper,0x90d2,0,0x10,1);
    if (register0x00000000 == (void *)0x0) {
      this_local = (AdvancedUsageSyncCS *)&DAT_ffffffffffffffff;
    }
    else {
      for (ref_data_1[0] = 0; ref_data_1[0] < 4; ref_data_1[0] = ref_data_1[0] + 1) {
        if (*(int *)((long)register0x00000000 + (long)ref_data_1[0] * 4) !=
            ref_data[(long)ref_data_1[0] + -2]) {
          anon_unknown_0::Output
                    ("[Buffer0] Data at index %d is %d should be %d.\n",(ulong)(uint)ref_data_1[0],
                     (ulong)*(uint *)((long)register0x00000000 + (long)ref_data_1[0] * 4),
                     (ulong)(uint)ref_data[(long)ref_data_1[0] + -2]);
          return (long)&DAT_ffffffffffffffff;
        }
      }
      glu::CallLogWrapper::glUnmapBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2);
      stack0xffffffffffffff34 = 0x500000003;
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,this->m_storage_buffer[1]);
      register0x00000000 =
           glu::CallLogWrapper::glMapBufferRange
                     (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper
                       .super_CallLogWrapper,0x90d2,0,8,1);
      if (register0x00000000 == (void *)0x0) {
        this_local = (AdvancedUsageSyncCS *)&DAT_ffffffffffffffff;
      }
      else {
        for (ref_data_2[0] = 0; ref_data_2[0] < 2; ref_data_2[0] = ref_data_2[0] + 1) {
          if (*(int *)((long)register0x00000000 + (long)ref_data_2[0] * 4) !=
              *(int *)((long)&data_8 + (long)ref_data_2[0] * 4 + 4)) {
            anon_unknown_0::Output
                      ("[Buffer1] Data at index %d is %d should be %d.\n",(ulong)(uint)ref_data_2[0]
                       ,(ulong)*(uint *)((long)register0x00000000 + (long)ref_data_2[0] * 4),
                       (ulong)*(uint *)((long)&data_8 + (long)ref_data_2[0] * 4 + 4));
            return (long)&DAT_ffffffffffffffff;
          }
        }
        glu::CallLogWrapper::glUnmapBuffer
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2);
        stack0xffffffffffffff1c = 0xa00000002;
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,this->m_storage_buffer[2]);
        _ref_data_3 = glu::CallLogWrapper::glMapBufferRange
                                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                                  super_GLWrapper.super_CallLogWrapper,0x90d2,0,8,1);
        if (_ref_data_3 == (void *)0x0) {
          this_local = (AdvancedUsageSyncCS *)&DAT_ffffffffffffffff;
        }
        else {
          for (data_10._4_4_ = 0; (int)data_10._4_4_ < 2; data_10._4_4_ = data_10._4_4_ + 1) {
            if (*(int *)((long)_ref_data_3 + (long)(int)data_10._4_4_ * 4) !=
                *(int *)((long)&data_9 + (long)(int)data_10._4_4_ * 4 + 4)) {
              anon_unknown_0::Output
                        ("[Buffer2] Data at index %d is %d should be %d.\n",(ulong)data_10._4_4_,
                         (ulong)*(uint *)((long)_ref_data_3 + (long)(int)data_10._4_4_ * 4),
                         (ulong)*(uint *)((long)&data_9 + (long)(int)data_10._4_4_ * 4 + 4));
              return (long)&DAT_ffffffffffffffff;
            }
          }
          glu::CallLogWrapper::glUnmapBuffer
                    (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x90d2);
          glu::CallLogWrapper::glBindBuffer
                    (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x90d2,this->m_storage_buffer[3]);
          pvVar3 = glu::CallLogWrapper::glMapBufferRange
                             (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                               super_GLWrapper.super_CallLogWrapper,0x90d2,0,4,1);
          if (pvVar3 == (void *)0x0) {
            this_local = (AdvancedUsageSyncCS *)&DAT_ffffffffffffffff;
          }
          else {
            for (ref_data_4[3] = 0; ref_data_4[3] < 1; ref_data_4[3] = ref_data_4[3] + 1) {
              if (*(int *)((long)pvVar3 + (long)ref_data_4[3] * 4) !=
                  ref_data_3[(long)ref_data_4[3] + -2]) {
                anon_unknown_0::Output
                          ("[Buffer3] Data at index %d is %d should be %d.\n",
                           (ulong)(uint)ref_data_4[3],
                           (ulong)*(uint *)((long)pvVar3 + (long)ref_data_4[3] * 4),
                           (ulong)(uint)ref_data_3[(long)ref_data_4[3] + -2]);
                return (long)&DAT_ffffffffffffffff;
              }
            }
            glu::CallLogWrapper::glUnmapBuffer
                      (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                        super_GLWrapper.super_CallLogWrapper,0x90d2);
            ref_data_4[0] = 4;
            ref_data_4[1] = 2;
            glu::CallLogWrapper::glBindBuffer
                      (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                        super_GLWrapper.super_CallLogWrapper,0x90d2,this->m_storage_buffer[4]);
            register0x00000000 =
                 glu::CallLogWrapper::glMapBufferRange
                           (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                             super_GLWrapper.super_CallLogWrapper,0x90d2,0,0x10,1);
            if (register0x00000000 == (void *)0x0) {
              this_local = (AdvancedUsageSyncCS *)&DAT_ffffffffffffffff;
            }
            else {
              for (ref_data_5[0] = 0; ref_data_5[0] < 4; ref_data_5[0] = ref_data_5[0] + 1) {
                if (*(int *)((long)register0x00000000 + (long)ref_data_5[0] * 4) !=
                    ref_data_4[(long)ref_data_5[0] + -2]) {
                  anon_unknown_0::Output
                            ("[Buffer4] Data at index %d is %d should be %d.\n",
                             (ulong)(uint)ref_data_5[0],
                             (ulong)*(uint *)((long)register0x00000000 + (long)ref_data_5[0] * 4),
                             (ulong)(uint)ref_data_4[(long)ref_data_5[0] + -2]);
                  return (long)&DAT_ffffffffffffffff;
                }
              }
              glu::CallLogWrapper::glUnmapBuffer
                        (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                          super_GLWrapper.super_CallLogWrapper,0x90d2);
              stack0xfffffffffffffed4 = 0x500000003;
              glu::CallLogWrapper::glBindBuffer
                        (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                          super_GLWrapper.super_CallLogWrapper,0x90d2,this->m_storage_buffer[5]);
              register0x00000000 =
                   glu::CallLogWrapper::glMapBufferRange
                             (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                               super_GLWrapper.super_CallLogWrapper,0x90d2,0,8,1);
              if (register0x00000000 == (void *)0x0) {
                this_local = (AdvancedUsageSyncCS *)&DAT_ffffffffffffffff;
              }
              else {
                for (ref_data_6[0] = 0; ref_data_6[0] < 2; ref_data_6[0] = ref_data_6[0] + 1) {
                  if (*(int *)((long)register0x00000000 + (long)ref_data_6[0] * 4) !=
                      *(int *)((long)&data_12 + (long)ref_data_6[0] * 4 + 4)) {
                    anon_unknown_0::Output
                              ("[Buffer5] Data at index %d is %d should be %d.\n",
                               (ulong)(uint)ref_data_6[0],
                               (ulong)*(uint *)((long)register0x00000000 + (long)ref_data_6[0] * 4),
                               (ulong)*(uint *)((long)&data_12 + (long)ref_data_6[0] * 4 + 4));
                    return (long)&DAT_ffffffffffffffff;
                  }
                }
                glu::CallLogWrapper::glUnmapBuffer
                          (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                            super_GLWrapper.super_CallLogWrapper,0x90d2);
                stack0xfffffffffffffebc = 0xa00000002;
                glu::CallLogWrapper::glBindBuffer
                          (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                            super_GLWrapper.super_CallLogWrapper,0x90d2,this->m_storage_buffer[6]);
                pvVar3 = glu::CallLogWrapper::glMapBufferRange
                                   (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                                     super_GLWrapper.super_CallLogWrapper,0x90d2,0,8,1);
                if (pvVar3 == (void *)0x0) {
                  this_local = (AdvancedUsageSyncCS *)&DAT_ffffffffffffffff;
                }
                else {
                  for (local_154 = 0; (int)local_154 < 2; local_154 = local_154 + 1) {
                    if (*(int *)((long)pvVar3 + (long)(int)local_154 * 4) !=
                        *(int *)((long)&data_13 + (long)(int)local_154 * 4 + 4)) {
                      anon_unknown_0::Output
                                ("[Buffer6] Data at index %d is %d should be %d.\n",(ulong)local_154
                                 ,(ulong)*(uint *)((long)pvVar3 + (long)(int)local_154 * 4),
                                 (ulong)*(uint *)((long)&data_13 + (long)(int)local_154 * 4 + 4));
                      return (long)&DAT_ffffffffffffffff;
                    }
                  }
                  glu::CallLogWrapper::glUnmapBuffer
                            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                              super_GLWrapper.super_CallLogWrapper,0x90d2);
                  this_local = (AdvancedUsageSyncCS *)0x0;
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    this_local = (AdvancedUsageSyncCS *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 1) in;" NL "layout(std430, binding = 0) coherent buffer Buffer0 {" NL
			   "  int g_data0, g_inc0;" NL "  int g_data1, g_inc1;" NL "};" NL
			   "layout(std430, binding = 1) buffer Buffer12 {" NL "  int inc, data;" NL "} g_buffer12[2];" NL
			   "layout(binding = 3, std430) coherent buffer Buffer3 {" NL "  int data;" NL "} g_buffer3;" NL
			   "layout(std430, binding = 4) coherent buffer Buffer4 {" NL "  int data0, inc0;" NL
			   "  int data1, inc1;" NL "} g_buffer4;" NL "layout(std430, binding = 5) buffer Buffer56 {" NL
			   "  int inc, data;" NL "} g_buffer56[2];" NL NL "void Modify1(int path) {" NL "  if (path == 0) {" NL
			   "    atomicAdd(g_data0, g_inc0);" NL "    atomicAdd(g_data1, g_inc0);" NL "  } else if (path == 1) {" NL
			   "    atomicAdd(g_data0, - g_inc0);" NL "    atomicAdd(g_data1, - g_inc0);" NL
			   "  } else if (path == 2) {" NL "    atomicAdd(g_data0, g_inc1);" NL "    atomicAdd(g_data1, g_inc1);" NL
			   "  }" NL "  if (path == 0) {" NL "    g_buffer12[0].data += g_buffer12[1].inc;" NL
			   "  } else if (path == 1) {" NL "    g_buffer12[1].data += g_buffer12[0].inc;" NL "  }" NL "}" NL NL
			   "void Modify2(int path) {" NL "  if (path == 0) {" NL
			   "    atomicAdd(g_buffer4.data0, g_buffer4.inc0);" NL "    atomicAdd(g_buffer4.data1, g_buffer4.inc0);" NL
			   "  } else if (path == 1) {" NL "    atomicAdd(g_buffer4.data0, - g_buffer4.inc0);" NL
			   "    atomicAdd(g_buffer4.data1, - g_buffer4.inc0);" NL "  } else if (path == 2) {" NL
			   "    atomicAdd(g_buffer4.data0, g_buffer4.inc1);" NL "    atomicAdd(g_buffer4.data1, g_buffer4.inc1);" NL
			   "  }" NL "  if (path == 0) {" NL "    g_buffer56[0].data += g_buffer56[1].inc;" NL
			   "  } else if (path == 1) {" NL "    g_buffer56[1].data += g_buffer56[0].inc;" NL "  }" NL "}" NL NL
			   "void main() {" NL "  Modify1(int(gl_WorkGroupID.z));" NL "  atomicAdd(g_buffer3.data, 1);" NL
			   "  Modify2(int(gl_WorkGroupID.z));" NL "}";

		m_program = CreateProgramCS(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(7, m_storage_buffer);

		/* Buffer0 */
		{
			int data[4] = { 0, 1, 0, 2 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer[0]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* Buffer1 */
		{
			int data[2] = { 3, 1 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storage_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* Buffer2 */
		{
			int data[2] = { 2, 4 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 2, m_storage_buffer[2]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* Buffer3 */
		{
			int data[1] = { 0 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 3, m_storage_buffer[3]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* Buffer4 */
		{
			int data[4] = { 0, 1, 0, 2 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 4, m_storage_buffer[4]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* Buffer5 */
		{
			int data[2] = { 3, 1 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 5, m_storage_buffer[5]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* Buffer6 */
		{
			int data[2] = { 2, 4 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 6, m_storage_buffer[6]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}

		glUseProgram(m_program);

		glDispatchCompute(1, 1, 3);
		glMemoryBarrier(GL_SHADER_STORAGE_BARRIER_BIT);
		glDispatchCompute(1, 1, 3);

		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		/* Buffer0 */
		{
			const int ref_data[4] = { 4, 1, 4, 2 };
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[0]);
			int* data = (int*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 16, GL_MAP_READ_BIT);
			if (!data)
				return ERROR;
			for (int i = 0; i < 4; ++i)
			{
				if (data[i] != ref_data[i])
				{
					Output("[Buffer0] Data at index %d is %d should be %d.\n", i, data[i], ref_data[i]);
					return ERROR;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		/* Buffer1 */
		{
			const int ref_data[2] = { 3, 5 };
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[1]);
			int* data = (int*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 8, GL_MAP_READ_BIT);
			if (!data)
				return ERROR;
			for (int i = 0; i < 2; ++i)
			{
				if (data[i] != ref_data[i])
				{
					Output("[Buffer1] Data at index %d is %d should be %d.\n", i, data[i], ref_data[i]);
					return ERROR;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		/* Buffer2 */
		{
			const int ref_data[2] = { 2, 10 };
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[2]);
			int* data = (int*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 8, GL_MAP_READ_BIT);
			if (!data)
				return ERROR;
			for (int i = 0; i < 2; ++i)
			{
				if (data[i] != ref_data[i])
				{
					Output("[Buffer2] Data at index %d is %d should be %d.\n", i, data[i], ref_data[i]);
					return ERROR;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		/* Buffer3 */
		{
			const int ref_data[1] = { 6 };
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[3]);
			int* data = (int*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 4, GL_MAP_READ_BIT);
			if (!data)
				return ERROR;
			for (int i = 0; i < 1; ++i)
			{
				if (data[i] != ref_data[i])
				{
					Output("[Buffer3] Data at index %d is %d should be %d.\n", i, data[i], ref_data[i]);
					return ERROR;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		/* Buffer4 */
		{
			const int ref_data[4] = { 4, 1, 4, 2 };
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[4]);
			int* data = (int*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 16, GL_MAP_READ_BIT);
			if (!data)
				return ERROR;
			for (int i = 0; i < 4; ++i)
			{
				if (data[i] != ref_data[i])
				{
					Output("[Buffer4] Data at index %d is %d should be %d.\n", i, data[i], ref_data[i]);
					return ERROR;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		/* Buffer5 */
		{
			const int ref_data[2] = { 3, 5 };
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[5]);
			int* data = (int*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 8, GL_MAP_READ_BIT);
			if (!data)
				return ERROR;
			for (int i = 0; i < 2; ++i)
			{
				if (data[i] != ref_data[i])
				{
					Output("[Buffer5] Data at index %d is %d should be %d.\n", i, data[i], ref_data[i]);
					return ERROR;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		/* Buffer6 */
		{
			const int ref_data[2] = { 2, 10 };
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[6]);
			int* data = (int*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 8, GL_MAP_READ_BIT);
			if (!data)
				return ERROR;
			for (int i = 0; i < 2; ++i)
			{
				if (data[i] != ref_data[i])
				{
					Output("[Buffer6] Data at index %d is %d should be %d.\n", i, data[i], ref_data[i]);
					return ERROR;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}

		return NO_ERROR;
	}